

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O0

bool __thiscall klogic::mlmvn_forward_base::step(mlmvn_forward_base *this)

{
  bool bVar1;
  size_t sVar2;
  pointer this_00;
  reference pcVar3;
  size_type sVar4;
  int iVar5;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_70;
  complex<double> *local_68;
  complex<double> *local_60;
  undefined8 local_58;
  undefined8 local_50;
  __normal_iterator<const_klogic::mvn_*,_std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>
  local_48;
  __normal_iterator<const_klogic::mvn_*,_std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>
  local_40;
  const_iterator i;
  vector<klogic::mvn,_std::allocator<klogic::mvn>_> *layer_neurons;
  iterator j;
  const_iterator from_end;
  const_iterator from_beg;
  mlmvn_forward_base *this_local;
  
  iVar5 = this->layer;
  sVar2 = mlmvn::layers_count(this->net);
  if ((ulong)(long)iVar5 < sVar2) {
    from_end = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                         (this->from);
    j._M_current = (complex<double> *)
                   __gnu_cxx::
                   __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                   ::operator+(&from_end,this->from_size);
    iVar5 = this->layer;
    sVar2 = mlmvn::layers_count(this->net);
    if (((long)iVar5 == sVar2 - 1) && ((this->use_out & 1U) != 0)) {
      layer_neurons = (vector<klogic::mvn,_std::allocator<klogic::mvn>_> *)(this->out)._M_current;
    }
    else {
      layer_neurons =
           (vector<klogic::mvn,_std::allocator<klogic::mvn>_> *)
           std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                     (this->to);
    }
    i._M_current = (mvn *)std::
                          vector<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                          ::operator[](&this->net->neurons,(long)this->layer);
    local_40._M_current =
         (mvn *)std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::begin
                          ((vector<klogic::mvn,_std::allocator<klogic::mvn>_> *)i._M_current);
    while( true ) {
      local_48._M_current =
           (mvn *)std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::end(i._M_current);
      bVar1 = __gnu_cxx::operator<(&local_40,&local_48);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_klogic::mvn_*,_std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>
                ::operator->(&local_40);
      local_60 = from_end._M_current;
      local_68 = j._M_current;
      mvn::output(this_00,from_end,(const_iterator)j._M_current);
      local_58 = extraout_XMM0_Qa;
      local_50 = in_XMM1_Qa;
      local_70 = __gnu_cxx::
                 __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                 ::operator++((__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                               *)&layer_neurons,0);
      pcVar3 = __gnu_cxx::
               __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
               ::operator*(&local_70);
      *(undefined8 *)pcVar3->_M_value = local_58;
      *(undefined8 *)(pcVar3->_M_value + 8) = local_50;
      __gnu_cxx::
      __normal_iterator<const_klogic::mvn_*,_std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>
      ::operator++(&local_40);
    }
    sVar4 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::size
                      ((vector<klogic::mvn,_std::allocator<klogic::mvn>_> *)i._M_current);
    this->from_size = sVar4;
    if (this->layer == 0) {
      this->from = &this->layer1;
      this->to = &this->layer2;
    }
    else if (this->from == &this->layer1) {
      this->from = &this->layer2;
      this->to = &this->layer1;
    }
    else {
      this->from = &this->layer1;
      this->to = &this->layer2;
    }
    iVar5 = this->layer + 1;
    this->layer = iVar5;
    sVar2 = mlmvn::layers_count(this->net);
    this_local._7_1_ = sVar2 <= (ulong)(long)iVar5;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool klogic::mlmvn_forward_base::step()
{
    // Don't do anything if we've already passed all layers
    if (layer >= net.layers_count())
        return true;

    // Use *from as input to layer neurons
    cvector::const_iterator from_beg = from->begin();
    cvector::const_iterator from_end = from_beg + from_size;

    // use *to or out as output
    cvector::iterator j = (layer == net.layers_count() - 1 && use_out)
        ? out : to->begin();

    const vector<mvn> &layer_neurons = net.neurons[layer];

    for (vector<mvn>::const_iterator i = layer_neurons.begin(); i < layer_neurons.end(); ++i)
        *j++ = i->output(from_beg, from_end);

    // Set up "from" and "to" for the next layer
    from_size = layer_neurons.size();

    if (layer == 0) {
        // for the first layer output is always in layer1
        from = &layer1;
        to = &layer2;
    } else if (from == &layer1) {
        from = &layer2;
        to = &layer1;
    } else {
        from = &layer1;
        to = &layer2;
    }

    return ++layer >= net.layers_count();
}